

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O2

int __thiscall
mcts::RandomPlayout<uttt::IBoard>::operator()(RandomPlayout<uttt::IBoard> *this,IBoard *game)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<long,_std::allocator<long>_> moves;
  IBoard ngame;
  uniform_int_distribution<int> local_68;
  _Vector_base<long,_std::allocator<long>_> local_60;
  IBoard local_48;
  
  if (operator()(uttt::IBoard_const&)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&operator()::rd);
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
    }
  }
  if (operator()(uttt::IBoard_const&)::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen);
    if (iVar1 != 0) {
      uVar3 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&operator()::gen,(ulong)uVar3);
      __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
    }
  }
  local_48._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
  local_48.macro = game->macro;
  local_48.micro._M_elems[0] = (game->micro)._M_elems[0];
  local_48.micro._M_elems[1] = (game->micro)._M_elems[1];
  local_48.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
  iVar1 = uttt::IBoard::GetStatus(&local_48);
  while (iVar1 == -1) {
    uttt::IBoard::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_60,&local_48);
    local_68._M_param._M_b =
         (int)((ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_68._M_param._M_a = 0;
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_68,&operator()::gen);
    uttt::IBoard::ApplyMove(&local_48,local_60._M_impl.super__Vector_impl_data._M_start + rVar2);
    iVar1 = uttt::IBoard::GetStatus(&local_48);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
  }
  return iVar1;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}